

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ValueType *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::MILSpec::ValueType>::New
          (Arena *arena)

{
  Arena *arena_local;
  ValueType *local_28;
  ValueType *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ValueType *)operator_new(0x20);
    CoreML::Specification::MILSpec::ValueType::ValueType(local_28);
  }
  else {
    local_28 = (ValueType *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::MILSpec::ValueType::typeinfo,
                          0x20);
    CoreML::Specification::MILSpec::ValueType::ValueType(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::MILSpec::ValueType>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }